

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O1

data_type * __thiscall
ctemplate::
small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::operator[](small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
             *this,key_type *key)

{
  data_type *ppvVar1;
  int iVar2;
  data_type *in_RAX;
  mapped_type *ppvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  data_type *ppvVar7;
  
  iVar2 = this->size_;
  lVar4 = (long)iVar2;
  if (lVar4 < 0) {
LAB_0012a04a:
    ppvVar3 = std::
              map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>
              ::operator[]((map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>
                            *)&(this->field_2).dummy_,key);
    return ppvVar3;
  }
  lVar5 = lVar4 * 0x10;
  lVar4 = lVar4 + 1;
  ppvVar7 = (data_type *)((long)&this->field_2 + lVar5 + 8);
  do {
    lVar6 = lVar4 + -1;
    if (lVar6 == 0 || lVar4 < 1) break;
    in_RAX = ppvVar7 + -2;
    ppvVar1 = ppvVar7 + -3;
    lVar4 = lVar6;
    ppvVar7 = in_RAX;
  } while (*ppvVar1 != (data_type)*key);
  if (lVar6 < 1) {
    if (iVar2 == 4) {
      ConvertToRealMap(this);
      goto LAB_0012a04a;
    }
    in_RAX = (data_type *)((long)&this->field_2 + lVar5 + 8);
    *(key_type *)((long)&this->field_2 + lVar5) = *key;
    *in_RAX = (data_type)0x0;
    this->size_ = iVar2 + 1;
  }
  return in_RAX;
}

Assistant:

data_type& operator[](const key_type& key) {
    key_equal compare;

    if (size_ >= 0) {
      // operator[] searches backwards, favoring recently-added
      // elements.
      for (int i = size_-1; i >= 0; --i) {
        if (compare(array_[i]->first, key)) {
          return array_[i]->second;
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();
        return (*map_)[key];
      } else {
        array_[size_].Init(key, data_type());
        return array_[size_++]->second;
      }
    } else {
      return (*map_)[key];
    }
  }